

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.cpp
# Opt level: O0

QRectF * __thiscall QRectF::normalized(QRectF *__return_storage_ptr__,QRectF *this)

{
  QRectF *this_local;
  
  __return_storage_ptr__->xp = -NAN;
  __return_storage_ptr__->yp = -NAN;
  __return_storage_ptr__->w = -NAN;
  __return_storage_ptr__->h = -NAN;
  __return_storage_ptr__->xp = this->xp;
  __return_storage_ptr__->yp = this->yp;
  __return_storage_ptr__->w = this->w;
  __return_storage_ptr__->h = this->h;
  if (__return_storage_ptr__->w <= 0.0 && __return_storage_ptr__->w != 0.0) {
    __return_storage_ptr__->xp = __return_storage_ptr__->w + __return_storage_ptr__->xp;
    __return_storage_ptr__->w = -__return_storage_ptr__->w;
  }
  if (__return_storage_ptr__->h <= 0.0 && __return_storage_ptr__->h != 0.0) {
    __return_storage_ptr__->yp = __return_storage_ptr__->h + __return_storage_ptr__->yp;
    __return_storage_ptr__->h = -__return_storage_ptr__->h;
  }
  return __return_storage_ptr__;
}

Assistant:

QRectF QRectF::normalized() const noexcept
{
    QRectF r = *this;
    if (r.w < 0) {
        r.xp += r.w;
        r.w = -r.w;
    }
    if (r.h < 0) {
        r.yp += r.h;
        r.h = -r.h;
    }
    return r;
}